

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtypedh.cpp
# Opt level: O2

void vmb_put_dh(char *buf,vm_val_t *val)

{
  uint16_t tmp;
  
  *buf = (char)val->typ;
  switch(val->typ) {
  case VM_OBJ:
  case VM_INT:
  case VM_SSTRING:
  case VM_DSTRING:
  case VM_LIST:
  case VM_CODEOFS:
  case VM_FUNCPTR:
  case VM_ENUM:
  case VM_OBJX:
    *(vm_obj_id_t *)(buf + 1) = (val->val).obj;
    break;
  case VM_PROP:
    *(vm_prop_id_t *)(buf + 1) = (val->val).prop;
    return;
  case VM_BIFPTR:
  case VM_BIFPTRX:
    *(unsigned_short *)(buf + 1) = (val->val).bifptr.func_idx;
    *(vm_prop_id_t *)(buf + 3) = (val->val).prop;
    return;
  }
  return;
}

Assistant:

void vmb_put_dh(char *buf, const vm_val_t *val)
{
    /* store the type code */
    buf[0] = (char)val->typ;

    /* store the value, in the appropriate type-dependent format */
    switch(val->typ)
    {
    case VM_OBJ:
    case VM_OBJX:
        /* store the object ID as a UINT4 */
        oswp4(buf+1, val->val.obj);
        break;

    case VM_PROP:
        /* store the property ID as a UINT2 */
        oswp2(buf+1, val->val.prop);
        break;

    case VM_INT:
        oswp4(buf+1, val->val.intval);
        break;

    case VM_BIFPTR:
    case VM_BIFPTRX:
        /* store the integer as two UINT2s: function index, set index */
        oswp2(buf+1, val->val.bifptr.func_idx);
        oswp2(buf+3, val->val.bifptr.set_idx);
        break;

    case VM_ENUM:
        /* store the enumerated constant value as a UINT4 */
        oswp4(buf+1, val->val.enumval);
        break;

    case VM_SSTRING:
    case VM_DSTRING:
    case VM_LIST:
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* store the offset value as a UINT4 */
        oswp4(buf+1, val->val.ofs);
        break;

    default:
        /* other types have no extra data or cannot be put into a DH */
        break;
    }
}